

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

void Gia_ManCollectRing(Gia_Man_t *p,Vec_Int_t *vStart,Vec_Int_t *vRes,Vec_Int_t *vDists)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  int Weight;
  int iFan;
  int iObj;
  int k;
  int i;
  Vec_Int_t *vDists_local;
  Vec_Int_t *vRes_local;
  Vec_Int_t *vStart_local;
  Gia_Man_t *p_local;
  
  iObj = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vStart);
    if (iVar1 <= iObj) {
      return;
    }
    iVar1 = Vec_IntEntry(vStart,iObj);
    iVar2 = Vec_IntEntry(vDists,iVar1);
    pGVar5 = Gia_ManObj(p,iVar1);
    if (iVar2 < 1) break;
    iVar3 = Gia_ObjIsAnd(pGVar5);
    if (iVar3 != 0) {
      iVar3 = Gia_ObjFaninId0(pGVar5,iVar1);
      pObj_00 = Gia_ObjFanin0(pGVar5);
      iVar4 = Gia_ObjIsBuf(pObj_00);
      Gia_ManRingAdd(p,iVar3,vRes,vDists,iVar2 + (uint)((iVar4 != 0 ^ 0xffU) & 1));
      iVar3 = Gia_ObjFaninId1(pGVar5,iVar1);
      pGVar5 = Gia_ObjFanin1(pGVar5);
      iVar4 = Gia_ObjIsBuf(pGVar5);
      Gia_ManRingAdd(p,iVar3,vRes,vDists,iVar2 + (uint)((iVar4 != 0 ^ 0xffU) & 1));
    }
    for (iFan = 0; iVar3 = Gia_ObjFanoutNumId(p,iVar1), iFan < iVar3; iFan = iFan + 1) {
      iVar3 = Gia_ObjFanoutId(p,iVar1,iFan);
      pGVar5 = Gia_ManObj(p,iVar3);
      iVar4 = Gia_ObjIsBuf(pGVar5);
      Gia_ManRingAdd(p,iVar3,vRes,vDists,iVar2 + (uint)((iVar4 != 0 ^ 0xffU) & 1));
    }
    iObj = iObj + 1;
  }
  __assert_fail("Weight > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                ,0x91c,"void Gia_ManCollectRing(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
               );
}

Assistant:

void Gia_ManCollectRing( Gia_Man_t * p, Vec_Int_t * vStart, Vec_Int_t * vRes, Vec_Int_t * vDists )
{
    int i, k, iObj, iFan;
    Vec_IntForEachEntry( vStart, iObj, i )
    {
        int Weight = Vec_IntEntry( vDists, iObj );
        Gia_Obj_t * pObj = Gia_ManObj(p, iObj);
        assert( Weight > 0 );
        if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ManRingAdd( p, Gia_ObjFaninId0(pObj, iObj), vRes, vDists, Weight + 1*!Gia_ObjIsBuf(Gia_ObjFanin0(pObj)) );
            Gia_ManRingAdd( p, Gia_ObjFaninId1(pObj, iObj), vRes, vDists, Weight + 1*!Gia_ObjIsBuf(Gia_ObjFanin1(pObj)) );
        }
        Gia_ObjForEachFanoutStaticId( p, iObj, iFan, k )
            Gia_ManRingAdd( p, iFan, vRes, vDists, Weight + 1*!Gia_ObjIsBuf(Gia_ManObj(p, iFan)) );
    }
}